

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O2

void mpiabi_neighbor_allgather_
               (void *sendbuf,MPIABI_Fint *sendcount,MPIABI_Fint *sendtype,void *recvbuf,
               MPIABI_Fint *recvcount,MPIABI_Fint *recvtype,MPIABI_Fint *comm,MPIABI_Fint *ierror)

{
  mpi_neighbor_allgather_();
  return;
}

Assistant:

void mpiabi_neighbor_allgather_(
  const void * sendbuf,
  const MPIABI_Fint * sendcount,
  const MPIABI_Fint * sendtype,
  void * recvbuf,
  const MPIABI_Fint * recvcount,
  const MPIABI_Fint * recvtype,
  const MPIABI_Fint * comm,
  MPIABI_Fint * ierror
) {
  return mpi_neighbor_allgather_(
    sendbuf,
    sendcount,
    sendtype,
    recvbuf,
    recvcount,
    recvtype,
    comm,
    ierror
  );
}